

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_lm_eval.c
# Opt level: O0

void evaluate_file(ngram_model_t *lm,logmath_t *lmath,char *lsnfn)

{
  char *pcVar1;
  size_t sVar2;
  float64 __x;
  double dVar3;
  double dVar4;
  int local_6c;
  int local_68;
  int32 tmp_lscr;
  int32 tmp_nccs;
  int32 tmp_noovs;
  int32 tmp_ch;
  int32 n;
  char **words;
  float64 log_to_log2;
  float64 ch;
  int32 lscr;
  int32 nwords;
  int32 noovs;
  int32 nccs;
  lineiter_t *litor;
  FILE *fh;
  char *lsnfn_local;
  logmath_t *lmath_local;
  ngram_model_t *lm_local;
  
  fh = (FILE *)lsnfn;
  lsnfn_local = (char *)lmath;
  lmath_local = (logmath_t *)lm;
  litor = (lineiter_t *)fopen(lsnfn,"r");
  if ((FILE *)litor == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
                   ,0xc6,"failed to open transcript file %s",fh);
    exit(1);
  }
  __x = logmath_get_base((logmath_t *)lsnfn_local);
  dVar3 = log((double)__x);
  dVar4 = log(2.0);
  words = (char **)(dVar3 / dVar4);
  ch._4_4_ = 0;
  lscr = 0;
  nwords = 0;
  ch._0_4_ = 0;
  log_to_log2 = 0.0;
  _noovs = lineiter_start((FILE *)litor);
  while( true ) {
    if (_noovs == (lineiter_t *)0x0) {
      log_to_log2 = (float64)((double)log_to_log2 / (double)(int)((ch._4_4_ - nwords) - lscr));
      printf("cross-entropy: %f bits\n",log_to_log2);
      pow(2.0,(double)log_to_log2);
      printf("perplexity: %f\n");
      printf("lm score: %d\n",(ulong)ch._0_4_);
      printf("%d words evaluated\n",(ulong)ch._4_4_);
      printf("%d OOVs (%.2f%%), %d context cues removed\n",
             ((double)lscr / (double)(int)ch._4_4_) * 100.0,(ulong)(uint)lscr,(ulong)(uint)nwords);
      return;
    }
    tmp_noovs = str2words(_noovs->buf,(char **)0x0,0);
    if (tmp_noovs < 0) break;
    if (tmp_noovs != 0) {
      _tmp_ch = (char **)__ckd_calloc__((long)tmp_noovs,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
                                        ,0xd6);
      str2words(_noovs->buf,_tmp_ch,tmp_noovs);
      if ((*_tmp_ch[tmp_noovs + -1] == '(') &&
         (pcVar1 = _tmp_ch[tmp_noovs + -1], sVar2 = strlen(_tmp_ch[tmp_noovs + -1]),
         pcVar1[sVar2 - 1] == ')')) {
        tmp_noovs = tmp_noovs + -1;
      }
      tmp_nccs = calc_entropy((ngram_model_t *)lmath_local,_tmp_ch,tmp_noovs,&local_68,&tmp_lscr,
                              &local_6c);
      log_to_log2 = (float64)((double)tmp_nccs * (double)((tmp_noovs - local_68) - tmp_lscr) *
                              (double)words + (double)log_to_log2);
      nwords = local_68 + nwords;
      lscr = tmp_lscr + lscr;
      ch._0_4_ = local_6c + ch._0_4_;
      ch._4_4_ = tmp_noovs + ch._4_4_;
      ckd_free(_tmp_ch);
    }
    _noovs = lineiter_next(_noovs);
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
          ,0xd3,"str2words(line, NULL, 0) = %d, should not happen\n",(ulong)(uint)tmp_noovs);
  exit(1);
}

Assistant:

static void
evaluate_file(ngram_model_t *lm, logmath_t *lmath, const char *lsnfn)
{
	FILE *fh;
        lineiter_t *litor;
	int32 nccs, noovs, nwords, lscr;
	float64 ch, log_to_log2;;

	if ((fh = fopen(lsnfn, "r")) == NULL)
		E_FATAL_SYSTEM("failed to open transcript file %s", lsnfn);

	/* We have to keep ch in floating-point to avoid overflows, so
	 * we might as well use log2. */
	log_to_log2 = log(logmath_get_base(lmath)) / log(2);
	lscr = nccs = noovs = nwords = 0;
	ch = 0.0;
        for (litor = lineiter_start(fh); litor; litor = lineiter_next(litor)) {
		char **words;
		int32 n, tmp_ch, tmp_noovs, tmp_nccs, tmp_lscr;

		n = str2words(litor->buf, NULL, 0);
		if (n < 0)
			E_FATAL("str2words(line, NULL, 0) = %d, should not happen\n", n);
		if (n == 0) /* Do nothing! */
			continue;
		words = ckd_calloc(n, sizeof(*words));
		str2words(litor->buf, words, n);

		/* Remove any utterance ID (FIXME: has to be a single "word") */
		if (words[n-1][0] == '('
		    && words[n-1][strlen(words[n-1])-1] == ')')
			n = n - 1;

		tmp_ch = calc_entropy(lm, words, n, &tmp_nccs,
                                      &tmp_noovs, &tmp_lscr);

		ch += (float64) tmp_ch * (n - tmp_nccs - tmp_noovs) * log_to_log2;
		nccs += tmp_nccs;
		noovs += tmp_noovs;
                lscr += tmp_lscr;
		nwords += n;
		
		ckd_free(words);
	}

	ch /= (nwords - nccs - noovs);
	printf("cross-entropy: %f bits\n", ch);

	/* Calculate perplexity pplx = exp CH */
	printf("perplexity: %f\n", pow(2.0, ch));
        printf("lm score: %d\n", lscr);

	/* Report OOVs and CCs */
	printf("%d words evaluated\n", nwords);
	printf("%d OOVs (%.2f%%), %d context cues removed\n",
	       noovs, (double)noovs / nwords * 100, nccs);
}